

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19bb9b::SwiftCompilerShellCommand::executeExternalCommand
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  _Any_data *p_Var1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  _func_int *p_Var5;
  pointer pcVar6;
  string *psVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  BuildEngineDelegate *pBVar12;
  long *plVar13;
  Child *pCVar14;
  raw_ostream *prVar15;
  pointer pbVar16;
  Child *pCVar17;
  ulong uVar18;
  Style style;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  long *plVar20;
  size_t sVar21;
  Child CVar22;
  SmallString<16U> *extraout_RDX;
  SmallString<16U> *extraout_RDX_00;
  SmallString<16U> *extraout_RDX_01;
  SmallString<16U> *extraout_RDX_02;
  SmallString<16U> *extraout_RDX_03;
  SmallString<16U> *pSVar23;
  SmallString<16U> *extraout_RDX_04;
  SmallString<16U> *extraout_RDX_05;
  SmallString<16U> *extraout_RDX_06;
  SmallString<16U> *extraout_RDX_07;
  SmallString<16U> *extraout_RDX_08;
  SmallString<16U> *extraout_RDX_09;
  SmallString<16U> *extraout_RDX_10;
  SmallString<16U> *extraout_RDX_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_15;
  SmallString<16U> *extraout_RDX_16;
  SmallString<16U> *extraout_RDX_17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_21;
  SmallString<16U> *extraout_RDX_22;
  SmallString<16U> *extraout_RDX_23;
  SmallString<16U> *extraout_RDX_24;
  SmallString<16U> *extraout_RDX_25;
  SmallString<16U> *extraout_RDX_26;
  SmallString<16U> *extraout_RDX_27;
  int iVar25;
  int __fd;
  ulong uVar26;
  char *pcVar27;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *O;
  StringRef outputFileMapPath_00;
  StringRef Filename;
  StringRef path;
  StringRef path_00;
  StringRef Str;
  ArrayRef<llvm::StringRef> commandLine_00;
  raw_fd_ostream os;
  SmallString<16U> depsPath_1;
  SmallString<16U> object;
  SmallString<16U> depsPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  SmallString<16U> masterDepsPath;
  SmallString<16U> swiftDepsPath;
  StringRef sourceStem;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsFiles;
  StringRef objectDir;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  SmallString<16U> data;
  SmallString<64U> outputFileMapPath;
  error_code ec;
  Child local_2f0;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  void *pvStack_2e0;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> OStack_2d8;
  undefined4 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  Child local_290;
  void *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  Child local_270;
  char *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  Child local_250;
  char *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string *local_230;
  Child local_228;
  void *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Child local_208;
  void *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *local_1e8;
  int local_1dc;
  TaskInterface local_1d8;
  TaskInterface local_1c8;
  long local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  Child local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [16];
  StringRef local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  QueueJobContext *local_158;
  SwiftCompilerShellCommand *local_150;
  StringRef local_148;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_138;
  undefined1 local_120 [24];
  _Manager_type local_108;
  _Invoker_type p_Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [64];
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  Twine local_88;
  Twine local_70;
  error_code local_58;
  Twine local_48;
  
  local_1d8.ctx = ti.ctx;
  local_1d8.impl = ti.impl;
  pbVar16 = (this->sourcesList).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar16 == pbVar2) {
    plVar13 = *(long **)((long)system->impl + 8);
    pcVar27 = "no configured \'sources\'";
  }
  else {
    pbVar3 = (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 == pbVar4) {
      plVar13 = *(long **)((long)system->impl + 8);
      pcVar27 = "no configured \'objects\'";
    }
    else if ((this->moduleName)._M_string_length == 0) {
      plVar13 = *(long **)((long)system->impl + 8);
      pcVar27 = "no configured \'module-name\'";
    }
    else if ((this->tempsPath)._M_string_length == 0) {
      plVar13 = *(long **)((long)system->impl + 8);
      pcVar27 = "no configured \'temps-path\'";
    }
    else {
      if ((long)pbVar2 - (long)pbVar16 == (long)pbVar4 - (long)pbVar3) {
        local_230 = &this->tempsPath;
        local_1e8 = &completionFn->Storage;
        local_158 = context;
        (**(code **)(**(long **)((long)system->impl + 0x10) + 0x18))();
        local_f8._M_allocated_capacity = (size_type)local_e8;
        local_f8._8_4_ = 0;
        local_f8._12_4_ = 0x40;
        getOutputFileMapPath(this,(SmallVectorImpl<char> *)&local_f8);
        local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start = (StringRef *)0x0;
        local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        outputFileMapPath_00.Length._0_4_ = local_f8._8_4_;
        outputFileMapPath_00.Data = (char *)local_f8._M_allocated_capacity;
        outputFileMapPath_00.Length._4_4_ = 0;
        constructCommandLineArgs(this,outputFileMapPath_00,&local_138);
        uVar10 = local_f8._M_allocated_capacity;
        pvVar9 = local_1d8.ctx;
        pvVar8 = local_1d8.impl;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((long)(this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("sourcesList.size() == objectsList.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                        ,0xad6,
                        "bool (anonymous namespace)::SwiftCompilerShellCommand::writeOutputFileMap(TaskInterface, StringRef, std::vector<std::string> &) const"
                       );
        }
        Filename.Length._0_4_ = local_f8._8_4_;
        Filename.Data = (char *)local_f8._M_allocated_capacity;
        uVar26 = (ulong)(uint)local_f8._8_4_;
        local_120._0_8_ = local_120 + 0x10;
        local_120._8_8_ = (void *)0x1000000000;
        local_58._M_value = 0;
        local_58._M_cat = (error_category *)std::_V2::system_category();
        Filename.Length._4_4_ = 0;
        llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&local_2f0,Filename,&local_58,F_Text)
        ;
        local_1dc = local_58._M_value;
        if (local_58._M_value == 0) {
          if ((ulong)((long)pvStack_2e0 -
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_) < 2) {
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1c44ab,(void *)0x2,
                       (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_);
          }
          else {
            *(undefined2 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ = 0xa7b
            ;
            OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 2;
          }
          local_1c8.impl = &local_1b8;
          local_1c8.ctx = (void *)0x1000000000;
          llvm::Twine::Twine((Twine *)&local_250,local_230);
          llvm::Twine::Twine((Twine *)&local_270,"master.swiftdeps");
          llvm::Twine::Twine((Twine *)&local_228,"");
          llvm::Twine::Twine((Twine *)&local_1a8,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&local_1c8,(Twine *)&local_250,(Twine *)&local_270,
                     (Twine *)&local_228,(Twine *)&local_1a8);
          if ((ulong)((long)pvStack_2e0 -
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_) < 8) {
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1ca282,(void *)0x8,
                       (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_);
            pSVar23 = extraout_RDX_00;
          }
          else {
            *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 0xa7b203a22222020;
            OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 8;
            pSVar23 = extraout_RDX;
          }
          if (this->enableWholeModuleOptimization == true) {
            local_250.twine = (Twine *)&local_240;
            local_248 = (char *)0x1000000000;
            llvm::Twine::Twine((Twine *)&local_228,local_230);
            pcVar6 = (this->moduleName)._M_dataplus._M_p;
            local_270.twine = (Twine *)&local_260;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,pcVar6,pcVar6 + (this->moduleName)._M_string_length);
            std::__cxx11::string::append(&local_270.character);
            llvm::Twine::Twine((Twine *)&local_1a8,(string *)&local_270);
            llvm::Twine::Twine((Twine *)&local_290,"");
            llvm::Twine::Twine((Twine *)&local_208,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&local_250,(Twine *)&local_228,(Twine *)&local_1a8,
                       (Twine *)&local_290,(Twine *)&local_208);
            if (local_270.twine != (Twine *)&local_260) {
              operator_delete(local_270.twine,
                              CONCAT71(local_260._M_allocated_capacity._1_7_,
                                       local_260._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250.twine ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_268 = (char *)0x0;
              local_260._M_local_buf[0] = '\0';
              local_270.twine = (Twine *)&local_260;
            }
            else {
              local_270.twine = (Twine *)&local_260;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_270,local_250.twine,
                         (long)&(local_250.twine)->LHS + ((ulong)local_248 & 0xffffffff));
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_270);
            if (local_270.twine != (Twine *)&local_260) {
              operator_delete(local_270.twine,
                              CONCAT71(local_260._M_allocated_capacity._1_7_,
                                       local_260._M_local_buf[0]) + 1);
            }
            local_268 = (char *)0x1000000000;
            local_270.twine = (Twine *)&local_260;
            llvm::Twine::Twine((Twine *)&local_1a8,local_230);
            local_228.twine = (Twine *)&local_218;
            pcVar6 = (this->moduleName)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_228,pcVar6,pcVar6 + (this->moduleName)._M_string_length);
            std::__cxx11::string::append(&local_228.character);
            llvm::Twine::Twine((Twine *)&local_290,(string *)&local_228);
            llvm::Twine::Twine((Twine *)&local_208,"");
            llvm::Twine::Twine(&local_88,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&local_270,(Twine *)&local_1a8,(Twine *)&local_290,
                       (Twine *)&local_208,&local_88);
            pSVar23 = extraout_RDX_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.twine != &local_218) {
              operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
              pSVar23 = extraout_RDX_02;
            }
            sVar21 = (long)pvStack_2e0 -
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
            if (sVar21 < 0x15) {
              pCVar14 = (Child *)llvm::raw_ostream::write
                                           ((raw_ostream *)&local_2f0,0x1ca291,(void *)0x15,sVar21);
              pSVar23 = extraout_RDX_03;
            }
            else {
              *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                   0x7065642220202020;
              pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ +
                                8);
              pcVar27[0] = 'e';
              pcVar27[1] = 'n';
              pcVar27[2] = 'd';
              pcVar27[3] = 'e';
              pcVar27[4] = 'n';
              pcVar27[5] = 'c';
              pcVar27[6] = 'i';
              pcVar27[7] = 'e';
              sVar21 = 0x22203a2273656963;
              pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ +
                                0xd);
              pcVar27[0] = 'c';
              pcVar27[1] = 'i';
              pcVar27[2] = 'e';
              pcVar27[3] = 's';
              pcVar27[4] = '\"';
              pcVar27[5] = ':';
              pcVar27[6] = ' ';
              pcVar27[7] = '\"';
              pCVar14 = &local_2f0;
              OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                   OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0x15;
            }
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&local_228,(basic *)&local_250.character,pSVar23);
            prVar15 = (raw_ostream *)
                      llvm::raw_ostream::write
                                ((raw_ostream *)pCVar14,local_228.decI,local_220,sVar21);
            pcVar27 = prVar15->OutBufCur;
            pSVar23 = (SmallString<16U> *)(prVar15->OutBufEnd + -(long)pcVar27);
            if (pSVar23 < (SmallString<16U> *)0x3) {
              llvm::raw_ostream::write(prVar15,0x1c456e,(void *)0x3,(size_t)pcVar27);
              pSVar23 = extraout_RDX_04;
            }
            else {
              pcVar27[2] = '\n';
              pcVar27[0] = '\"';
              pcVar27[1] = ',';
              prVar15->OutBufCur = prVar15->OutBufCur + 3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.twine != &local_218) {
              operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
              pSVar23 = extraout_RDX_05;
            }
            sVar21 = (long)pvStack_2e0 -
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
            if (sVar21 < 0xf) {
              pCVar14 = (Child *)llvm::raw_ostream::write
                                           ((raw_ostream *)&local_2f0,0x1ca2a7,(void *)0xf,sVar21);
              pSVar23 = extraout_RDX_06;
            }
            else {
              pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ +
                                7);
              pcVar27[0] = 'j';
              pcVar27[1] = 'e';
              pcVar27[2] = 'c';
              pcVar27[3] = 't';
              pcVar27[4] = '\"';
              pcVar27[5] = ':';
              pcVar27[6] = ' ';
              pcVar27[7] = '\"';
              sVar21 = 0x6a626f2220202020;
              *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                   0x6a626f2220202020;
              pCVar14 = &local_2f0;
              OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                   OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0xf;
            }
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&local_228,(basic *)&local_270.character,pSVar23);
            prVar15 = (raw_ostream *)
                      llvm::raw_ostream::write
                                ((raw_ostream *)pCVar14,local_228.decI,local_220,sVar21);
            pcVar27 = prVar15->OutBufCur;
            pSVar23 = (SmallString<16U> *)(prVar15->OutBufEnd + -(long)pcVar27);
            if (pSVar23 < (SmallString<16U> *)0x3) {
              llvm::raw_ostream::write(prVar15,0x1c456e,(void *)0x3,(size_t)pcVar27);
              pSVar23 = extraout_RDX_07;
            }
            else {
              pcVar27[2] = '\n';
              pcVar27[0] = '\"';
              pcVar27[1] = ',';
              prVar15->OutBufCur = prVar15->OutBufCur + 3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228.twine != &local_218) {
              operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
              pSVar23 = extraout_RDX_08;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270.twine != &local_260) {
              free(local_270.twine);
              pSVar23 = extraout_RDX_09;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250.twine != &local_240) {
              free(local_250.twine);
              pSVar23 = extraout_RDX_10;
            }
          }
          pCVar14 = &local_2f0;
          sVar21 = (long)pvStack_2e0 -
                   OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
          if (sVar21 < 0x1b) {
            pCVar14 = (Child *)llvm::raw_ostream::write
                                         ((raw_ostream *)&local_2f0,0x1ca2b7,(void *)0x1b,sVar21);
            pSVar23 = extraout_RDX_11;
          }
          else {
            pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ +
                              0xb);
            pcVar27[0] = 'd';
            pcVar27[1] = 'e';
            pcVar27[2] = 'p';
            pcVar27[3] = 'e';
            pcVar27[4] = 'n';
            pcVar27[5] = 'd';
            pcVar27[6] = 'e';
            pcVar27[7] = 'n';
            pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ +
                              0x13);
            pcVar27[0] = 'c';
            pcVar27[1] = 'i';
            pcVar27[2] = 'e';
            pcVar27[3] = 's';
            pcVar27[4] = '\"';
            pcVar27[5] = ':';
            pcVar27[6] = ' ';
            pcVar27[7] = '\"';
            *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 0x6977732220202020;
            pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 8
                              );
            pcVar27[0] = 'f';
            pcVar27[1] = 't';
            pcVar27[2] = '-';
            pcVar27[3] = 'd';
            pcVar27[4] = 'e';
            pcVar27[5] = 'p';
            pcVar27[6] = 'e';
            pcVar27[7] = 'n';
            OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0x1b;
          }
          llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                    ((string *)&local_250,(basic *)&local_1c8,pSVar23);
          __fd = local_250.decI;
          prVar15 = (raw_ostream *)
                    llvm::raw_ostream::write((raw_ostream *)pCVar14,__fd,local_248,sVar21);
          pcVar27 = prVar15->OutBufCur;
          if ((ulong)((long)prVar15->OutBufEnd - (long)pcVar27) < 2) {
            __fd = 0x1cf0d5;
            llvm::raw_ostream::write(prVar15,0x1cf0d5,(void *)0x2,(size_t)pcVar27);
          }
          else {
            pcVar27[0] = '\"';
            pcVar27[1] = '\n';
            prVar15->OutBufCur = prVar15->OutBufCur + 2;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250.twine != &local_240) {
            uVar26 = local_240._M_allocated_capacity + 1;
            operator_delete(local_250.twine,uVar26);
            __fd = (int)uVar26;
          }
          if ((ulong)((long)pvStack_2e0 -
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_) < 5) {
            __fd = 0x1c4434;
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1c4434,(void *)0x5,
                       (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_);
          }
          else {
            *(char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 4) = '\n';
            *(undefined4 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 0x2c7d2020;
            OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 5;
          }
          pbVar16 = (this->sourcesList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->sourcesList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pbVar16) {
            iVar25 = 1;
            uVar26 = 0;
            local_150 = this;
            do {
              local_230 = (string *)CONCAT44(local_230._4_4_,iVar25);
              local_250.twine = (Twine *)&local_240;
              pcVar6 = pbVar16[uVar26]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_250,pcVar6,pcVar6 + pbVar16[uVar26]._M_string_length);
              pbVar16 = (this->objectsList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              CVar22.twine = (Twine *)&local_260;
              pcVar6 = pbVar16[uVar26]._M_dataplus._M_p;
              local_270.twine = CVar22.twine;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_270,pcVar6,pcVar6 + pbVar16[uVar26]._M_string_length);
              path.Length = 2;
              path.Data = local_268;
              style = CVar22.decUI;
              local_148 = llvm::sys::path::parent_path((path *)local_270.twine,path,style);
              path_00.Length = 2;
              path_00.Data = local_248;
              local_188 = llvm::sys::path::stem((path *)local_250.twine,path_00,style);
              local_228.twine = (Twine *)&local_218;
              local_220 = (void *)0x1000000000;
              llvm::Twine::Twine((Twine *)&local_1a8,&local_148);
              llvm::Twine::Twine((Twine *)&local_290,&local_188,"~partial.swiftmodule");
              llvm::Twine::Twine((Twine *)&local_208,"");
              llvm::Twine::Twine(&local_88,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&local_228,(Twine *)&local_1a8,(Twine *)&local_290
                         ,(Twine *)&local_208,&local_88);
              local_1a8.twine = (Twine *)local_198;
              local_1a0 = 0x1000000000;
              llvm::Twine::Twine((Twine *)&local_290,&local_148);
              llvm::Twine::Twine((Twine *)&local_208,&local_188,".swiftdeps");
              llvm::Twine::Twine(&local_88,"");
              llvm::Twine::Twine(&local_70,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&local_1a8,(Twine *)&local_290,(Twine *)&local_208
                         ,&local_88,&local_70);
              sVar21 = (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
              if (sVar21 < 3) {
                pCVar14 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)&local_2f0,0x1c4477,(void *)0x3,sVar21)
                ;
                pbVar24 = extraout_RDX_13;
              }
              else {
                *(char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 2) =
                     '\"';
                *(undefined2 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     0x2020;
                OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 3;
                pCVar14 = &local_2f0;
                pbVar24 = extraout_RDX_12;
              }
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&local_290,(basic *)&local_250.character,pbVar24);
              prVar15 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar14,local_290.decI,local_288,sVar21);
              this = local_150;
              pcVar27 = prVar15->OutBufCur;
              pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (prVar15->OutBufEnd + -(long)pcVar27);
              if (pbVar24 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5
                 ) {
                llvm::raw_ostream::write(prVar15,0x1ca285,(void *)0x5,(size_t)pcVar27);
                pbVar24 = extraout_RDX_14;
              }
              else {
                builtin_strncpy(pcVar27,"\": {\n",5);
                prVar15->OutBufCur = prVar15->OutBufCur + 5;
              }
              if (local_290.twine != (Twine *)&local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
                pbVar24 = extraout_RDX_15;
              }
              if (this->enableWholeModuleOptimization == false) {
                local_288 = (void *)0x1000000000;
                local_290.twine = (Twine *)&local_280;
                llvm::Twine::Twine((Twine *)&local_208,&local_148);
                llvm::Twine::Twine(&local_88,&local_188,".d");
                llvm::Twine::Twine(&local_70,"");
                llvm::Twine::Twine(&local_48,"");
                llvm::sys::path::append
                          ((SmallVectorImpl<char> *)&local_290,(Twine *)&local_208,&local_88,
                           &local_70,&local_48);
                sVar21 = (long)pvStack_2e0 -
                         OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
                if (sVar21 < 0x15) {
                  pCVar14 = (Child *)llvm::raw_ostream::write
                                               ((raw_ostream *)&local_2f0,0x1ca291,(void *)0x15,
                                                sVar21);
                  pSVar23 = extraout_RDX_17;
                }
                else {
                  *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                       0x7065642220202020;
                  pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer.
                                     _0_8_ + 8);
                  pcVar27[0] = 'e';
                  pcVar27[1] = 'n';
                  pcVar27[2] = 'd';
                  pcVar27[3] = 'e';
                  pcVar27[4] = 'n';
                  pcVar27[5] = 'c';
                  pcVar27[6] = 'i';
                  pcVar27[7] = 'e';
                  sVar21 = 0x22203a2273656963;
                  pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer.
                                     _0_8_ + 0xd);
                  pcVar27[0] = 'c';
                  pcVar27[1] = 'i';
                  pcVar27[2] = 'e';
                  pcVar27[3] = 's';
                  pcVar27[4] = '\"';
                  pcVar27[5] = ':';
                  pcVar27[6] = ' ';
                  pcVar27[7] = '\"';
                  OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0x15;
                  pCVar14 = &local_2f0;
                  pSVar23 = extraout_RDX_16;
                }
                llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                          ((string *)&local_208,(basic *)&local_290.character,pSVar23);
                prVar15 = (raw_ostream *)
                          llvm::raw_ostream::write
                                    ((raw_ostream *)pCVar14,local_208.decI,local_200,sVar21);
                pcVar27 = prVar15->OutBufCur;
                if ((ulong)((long)prVar15->OutBufEnd - (long)pcVar27) < 3) {
                  llvm::raw_ostream::write(prVar15,0x1c456e,(void *)0x3,(size_t)pcVar27);
                }
                else {
                  pcVar27[2] = '\n';
                  pcVar27[0] = '\"';
                  pcVar27[1] = ',';
                  prVar15->OutBufCur = prVar15->OutBufCur + 3;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.twine != &local_1f8) {
                  operator_delete(local_208.twine,
                                  CONCAT71(local_1f8._M_allocated_capacity._1_7_,
                                           local_1f8._M_local_buf[0]) + 1);
                }
                local_208.twine = (Twine *)&local_1f8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290.twine ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  local_200 = (void *)0x0;
                  local_1f8._M_local_buf[0] = '\0';
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_208,local_290.twine,
                             (long)&(local_290.twine)->LHS + ((ulong)local_288 & 0xffffffff));
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_178,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208);
                pbVar24 = extraout_RDX_18;
                if (local_208.twine != (Twine *)&local_1f8) {
                  operator_delete(local_208.twine,
                                  CONCAT71(local_1f8._M_allocated_capacity._1_7_,
                                           local_1f8._M_local_buf[0]) + 1);
                  pbVar24 = extraout_RDX_19;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290.twine != &local_280) {
                  free(local_290.twine);
                  pbVar24 = extraout_RDX_20;
                }
              }
              pCVar14 = &local_2f0;
              sVar21 = (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
              if (sVar21 < 0xf) {
                pCVar17 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar14,0x1ca2a7,(void *)0xf,sVar21);
                pbVar24 = extraout_RDX_21;
              }
              else {
                pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_
                                  + 7);
                pcVar27[0] = 'j';
                pcVar27[1] = 'e';
                pcVar27[2] = 'c';
                pcVar27[3] = 't';
                pcVar27[4] = '\"';
                pcVar27[5] = ':';
                pcVar27[6] = ' ';
                pcVar27[7] = '\"';
                sVar21 = 0x6a626f2220202020;
                *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     0x6a626f2220202020;
                OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0xf;
                pCVar17 = pCVar14;
              }
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)&local_290,(basic *)&local_270.character,pbVar24);
              prVar15 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar17,local_290.decI,local_288,sVar21);
              pcVar27 = prVar15->OutBufCur;
              pSVar23 = (SmallString<16U> *)(prVar15->OutBufEnd + -(long)pcVar27);
              if (pSVar23 < (SmallString<16U> *)0x3) {
                llvm::raw_ostream::write(prVar15,0x1c456e,(void *)0x3,(size_t)pcVar27);
                pSVar23 = extraout_RDX_22;
              }
              else {
                pcVar27[2] = '\n';
                pcVar27[0] = '\"';
                pcVar27[1] = ',';
                prVar15->OutBufCur = prVar15->OutBufCur + 3;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.twine != &local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
                pSVar23 = extraout_RDX_23;
              }
              sVar21 = (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
              if (sVar21 < 0x14) {
                pCVar17 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar14,0x1ca2e8,(void *)0x14,sVar21);
                pSVar23 = extraout_RDX_24;
              }
              else {
                *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     0x6977732220202020;
                pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_
                                  + 8);
                pcVar27[0] = 'f';
                pcVar27[1] = 't';
                pcVar27[2] = 'm';
                pcVar27[3] = 'o';
                pcVar27[4] = 'd';
                pcVar27[5] = 'u';
                pcVar27[6] = 'l';
                pcVar27[7] = 'e';
                pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_
                                  + 0x10);
                pcVar27[0] = '\"';
                pcVar27[1] = ':';
                pcVar27[2] = ' ';
                pcVar27[3] = '\"';
                OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0x14;
                pCVar17 = pCVar14;
              }
              llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                        ((string *)&local_290,(basic *)&local_228.character,pSVar23);
              prVar15 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar17,local_290.decI,local_288,sVar21);
              pcVar27 = prVar15->OutBufCur;
              pSVar23 = (SmallString<16U> *)(prVar15->OutBufEnd + -(long)pcVar27);
              if (pSVar23 < (SmallString<16U> *)0x3) {
                llvm::raw_ostream::write(prVar15,0x1c456e,(void *)0x3,(size_t)pcVar27);
                pSVar23 = extraout_RDX_25;
              }
              else {
                pcVar27[2] = '\n';
                pcVar27[0] = '\"';
                pcVar27[1] = ',';
                prVar15->OutBufCur = prVar15->OutBufCur + 3;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.twine != &local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
                pSVar23 = extraout_RDX_26;
              }
              sVar21 = (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_;
              if (sVar21 < 0x1b) {
                pCVar17 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar14,0x1ca2b7,(void *)0x1b,sVar21);
                pSVar23 = extraout_RDX_27;
              }
              else {
                pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_
                                  + 0xb);
                pcVar27[0] = 'd';
                pcVar27[1] = 'e';
                pcVar27[2] = 'p';
                pcVar27[3] = 'e';
                pcVar27[4] = 'n';
                pcVar27[5] = 'd';
                pcVar27[6] = 'e';
                pcVar27[7] = 'n';
                pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_
                                  + 0x13);
                pcVar27[0] = 'c';
                pcVar27[1] = 'i';
                pcVar27[2] = 'e';
                pcVar27[3] = 's';
                pcVar27[4] = '\"';
                pcVar27[5] = ':';
                pcVar27[6] = ' ';
                pcVar27[7] = '\"';
                *(undefined8 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     0x6977732220202020;
                pcVar27 = (char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_
                                  + 8);
                pcVar27[0] = 'f';
                pcVar27[1] = 't';
                pcVar27[2] = '-';
                pcVar27[3] = 'd';
                pcVar27[4] = 'e';
                pcVar27[5] = 'p';
                pcVar27[6] = 'e';
                pcVar27[7] = 'n';
                OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 0x1b;
                pCVar17 = pCVar14;
              }
              llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                        ((string *)&local_290,(basic *)&local_1a8.character,pSVar23);
              prVar15 = (raw_ostream *)
                        llvm::raw_ostream::write
                                  ((raw_ostream *)pCVar17,local_290.decI,local_288,sVar21);
              pcVar27 = prVar15->OutBufCur;
              if ((ulong)((long)prVar15->OutBufEnd - (long)pcVar27) < 2) {
                llvm::raw_ostream::write(prVar15,0x1cf0d5,(void *)0x2,(size_t)pcVar27);
              }
              else {
                pcVar27[0] = '\"';
                pcVar27[1] = '\n';
                prVar15->OutBufCur = prVar15->OutBufCur + 2;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.twine != &local_280) {
                operator_delete(local_290.twine,local_280._M_allocated_capacity + 1);
              }
              psVar7 = local_230;
              iVar25 = (int)local_230;
              if ((ulong)((long)pvStack_2e0 -
                         OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_) < 3) {
                pCVar14 = (Child *)llvm::raw_ostream::write
                                             ((raw_ostream *)pCVar14,0x1c4461,(void *)0x3,
                                              (long)pvStack_2e0 -
                                              OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.
                                              buffer._0_8_);
              }
              else {
                *(char *)(OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 2) =
                     '}';
                *(undefined2 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     0x2020;
                OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 3;
              }
              uVar26 = (ulong)psVar7 & 0xffffffff;
              uVar18 = (long)(this->sourcesList).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->sourcesList).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              pcVar27 = "";
              if (uVar26 < uVar18) {
                pcVar27 = ",";
              }
              Str.Length._0_1_ = uVar26 < uVar18;
              Str.Data = pcVar27;
              Str.Length._1_7_ = 0;
              prVar15 = llvm::raw_ostream::operator<<((raw_ostream *)pCVar14,Str);
              __fd = (int)pcVar27;
              pcVar27 = prVar15->OutBufCur;
              if (prVar15->OutBufEnd == pcVar27) {
                __fd = 0x1c49b4;
                llvm::raw_ostream::write(prVar15,0x1c49b4,(void *)0x1,(size_t)pcVar27);
              }
              else {
                *pcVar27 = '\n';
                prVar15->OutBufCur = prVar15->OutBufCur + 1;
              }
              if (local_1a8.twine != (Twine *)local_198) {
                free(local_1a8.twine);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228.twine != &local_218) {
                free(local_228.twine);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270.twine != &local_260) {
                uVar18 = CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]) +
                         1;
                operator_delete(local_270.twine,uVar18);
                __fd = (int)uVar18;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250.twine != &local_240) {
                uVar18 = local_240._M_allocated_capacity + 1;
                operator_delete(local_250.twine,uVar18);
                __fd = (int)uVar18;
              }
              pbVar16 = (this->sourcesList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar25 = iVar25 + 1;
            } while ((long)(this->sourcesList).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16 >> 5 != uVar26
                    );
          }
          if ((ulong)((long)pvStack_2e0 -
                     OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_) < 2) {
            __fd = 0x1c45cc;
            llvm::raw_ostream::write
                      ((raw_ostream *)&local_2f0,0x1c45cc,(void *)0x2,
                       (long)pvStack_2e0 -
                       OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_);
          }
          else {
            *(undefined2 *)OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ = 0xa7d
            ;
            OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ =
                 OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ + 2;
          }
          O = local_1e8;
          llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_2f0,__fd);
          if ((long *)local_1c8.impl != &local_1b8) {
            free(local_1c8.impl);
          }
        }
        else {
          local_1c8.impl = pvVar8;
          local_1c8.ctx = pvVar9;
          pBVar12 = llbuild::core::TaskInterface::delegate(&local_1c8);
          p_Var5 = pBVar12[1]._vptr_BuildEngineDelegate[1];
          local_270.twine = (Twine *)&local_260;
          if ((undefined1 *)uVar10 == (undefined1 *)0x0) {
            local_268 = (char *)0x0;
            local_260._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,uVar10,(undefined1 *)(uVar26 + uVar10));
          }
          plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x1ca24d);
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 == paVar19) {
            local_240._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_240._8_8_ = plVar13[3];
            local_250.twine = (Twine *)&local_240;
          }
          else {
            local_240._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_250.twine = (Twine *)*plVar13;
          }
          local_248 = (char *)plVar13[1];
          *plVar13 = (long)paVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append(&local_250.character);
          plVar20 = plVar13 + 2;
          if ((long *)*plVar13 == plVar20) {
            local_1b8 = *plVar20;
            uStack_1b0 = (undefined4)plVar13[3];
            uStack_1ac = *(undefined4 *)((long)plVar13 + 0x1c);
            local_1c8.impl = &local_1b8;
          }
          else {
            local_1b8 = *plVar20;
            local_1c8.impl = (long *)*plVar13;
          }
          local_1c8.ctx = (void *)plVar13[1];
          *plVar13 = (long)plVar20;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          (**(code **)(*(long *)p_Var5 + 0x58))(p_Var5,this,local_1c8.impl,local_1c8.ctx);
          if ((long *)local_1c8.impl != &local_1b8) {
            operator_delete(local_1c8.impl,local_1b8 + 1);
          }
          if (local_250.twine != (Twine *)&local_240) {
            operator_delete(local_250.twine,local_240._M_allocated_capacity + 1);
          }
          O = local_1e8;
          if (local_270.twine != (Twine *)&local_260) {
            operator_delete(local_270.twine,
                            CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]
                                    ) + 1);
          }
        }
        llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_2f0);
        if ((SwiftCompilerShellCommand *)local_120._0_8_ !=
            (SwiftCompilerShellCommand *)(local_120 + 0x10)) {
          free((void *)local_120._0_8_);
        }
        if (local_1dc == 0) {
          commandLine_00.Length =
               (long)local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
          commandLine_00.Data =
               local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
          uVar11 = llbuild::core::TaskInterface::spawn(&local_1d8,local_158,commandLine_00);
          if (uVar11 == Succeeded) {
            local_2f0.decUI = (uint)this;
            local_2f0._4_4_ = (undefined4)((ulong)this >> 0x20);
            local_2e8 = SUB84(local_1d8.impl,0);
            uStack_2e4 = (undefined4)((ulong)local_1d8.impl >> 0x20);
            pvStack_2e0 = local_1d8.ctx;
            llvm::optional_detail::
            OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::
            OptionalStorage(&OStack_2d8,O);
            local_2b0 = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_2a8,&local_178);
            std::function<void(llbuild::basic::QueueJobContext*)>::
            function<(anonymous_namespace)::SwiftCompilerShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::_lambda(llbuild::basic::QueueJobContext*)_1_,void>
                      ((function<void(llbuild::basic::QueueJobContext*)> *)local_a8._M_pod_data,
                       (anon_class_96_5_980d2744 *)&local_2f0);
            p_Var1 = (_Any_data *)(local_120 + 8);
            local_120._8_8_ = (void *)0x0;
            local_120._16_8_ = 0;
            local_108 = (_Manager_type)0x0;
            p_Stack_100 = (_Invoker_type)0x0;
            local_120._0_8_ = this;
            if (local_98 != (_Manager_type)0x0) {
              (*local_98)(p_Var1,&local_a8,__clone_functor);
              local_108 = local_98;
              p_Stack_100 = p_Stack_90;
            }
            llbuild::core::TaskInterface::spawn(&local_1d8,(QueueJob *)local_120,High);
            if (local_108 != (_Manager_type)0x0) {
              (*local_108)(p_Var1,p_Var1,__destroy_functor);
            }
            if (local_98 != (_Manager_type)0x0) {
              (*local_98)(&local_a8,&local_a8,__destroy_functor);
            }
            (anonymous_namespace)::SwiftCompilerShellCommand::
            executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
            ::{lambda(llbuild::basic::QueueJobContext*)#1}::~Optional
                      ((_lambda_llbuild__basic__QueueJobContext___1_ *)&local_2f0.character);
            goto LAB_001486e0;
          }
          if (O->hasVal != true) goto LAB_001486e0;
        }
        else {
          if (O->hasVal != true) goto LAB_001486e0;
          local_2f0.decUI = Failed;
          uVar11 = local_2f0.decUI;
        }
        local_2f0.decUI = uVar11;
        local_2e8 = 0xffffffff;
        local_2f0._4_4_ = 0xffffffff;
        pvStack_2e0 = (void *)0x0;
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer._0_8_ = (char *)0x0;
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[8] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[9] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[10] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xb] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xc] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xd] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xe] = '\0';
        OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xf] = '\0';
        if (*(long *)((O->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x10) != 0) {
          (**(code **)((O->storage).super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))(O,&local_2f0);
LAB_001486e0:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          if (local_138.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_start != (StringRef *)0x0) {
            operator_delete(local_138.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_138.
                                  super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_138.
                                  super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((undefined1 *)local_f8._M_allocated_capacity == local_e8) {
            return;
          }
          free((void *)local_f8._M_allocated_capacity);
          return;
        }
        goto LAB_0014872d;
      }
      plVar13 = *(long **)((long)system->impl + 8);
      pcVar27 = "\'sources\' and \'objects\' are not the same size";
    }
  }
  local_f8._8_4_ = 0;
  local_f8._M_allocated_capacity = 0;
  llvm::Twine::Twine((Twine *)&local_2f0,pcVar27);
  (**(code **)(*plVar13 + 0x18))(plVar13,"",0,&local_f8,&local_2f0);
  if ((completionFn->Storage).hasVal == true) {
    local_2f0.decUI = Failed;
    local_2f0._4_4_ = 0xffffffff;
    local_2e8 = 0xffffffff;
    pvStack_2e0 = (void *)0x0;
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[1] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[2] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[3] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[4] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[5] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[6] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[7] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[8] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[9] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[10] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xb] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xc] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xd] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xe] = '\0';
    OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xf] = '\0';
    if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
        == 0) {
LAB_0014872d:
      local_2e8 = 0xffffffff;
      local_2f0._4_4_ = 0xffffffff;
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[8] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[9] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[10] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xb] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xc] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xd] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xe] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0xf] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[0] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[1] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[2] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[3] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[4] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[5] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[6] = '\0';
      OStack_2d8.storage.super_AlignedCharArray<8UL,_32UL>.buffer[7] = '\0';
      pvStack_2e0 = (void *)0x0;
      std::__throw_bad_function_call();
    }
    (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
              (completionFn,&local_2f0);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // FIXME: Need to add support for required parameters.
    if (sourcesList.empty()) {
      system.getDelegate().error("", {}, "no configured 'sources'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (objectsList.empty()) {
      system.getDelegate().error("", {}, "no configured 'objects'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (moduleName.empty()) {
      system.getDelegate().error("", {}, "no configured 'module-name'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (tempsPath.empty()) {
      system.getDelegate().error("", {}, "no configured 'temps-path'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    if (sourcesList.size() != objectsList.size()) {
      system.getDelegate().error(
          "", {}, "'sources' and 'objects' are not the same size");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Ensure the temporary directory exists.
    //
    // We ignore failures here, and just let things that depend on this fail.
    //
    // FIXME: This should really be done using an additional implicit input, so
    // it only happens once per build.
    (void) system.getFileSystem().createDirectories(tempsPath);
 
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    // Form the complete command.
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);

    // Write the output file map.
    std::vector<std::string> depsFiles;
    if (!writeOutputFileMap(ti, outputFileMapPath, depsFiles)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Execute the command.
    auto result = ti.spawn(context, commandLine);

    if (result != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Load all of the discovered dependencies.
    ti.spawn({ this, [this, ti, completionFn, result, depsFiles](QueueJobContext* context) mutable {
      for (const auto& depsPath: depsFiles) {
        if (!processDiscoveredDependencies(ti, depsPath)) {
          if (completionFn.hasValue())
            completionFn.getValue()(ProcessStatus::Failed);
          return;
        }
      }
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }}, basic::QueueJobPriority::High);
  }